

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O2

Node256Leaf * duckdb::Node256Leaf::GrowNode15Leaf(ART *art,Node *node256_leaf,Node *node15_leaf)

{
  byte bVar1;
  byte bVar2;
  Node15Leaf *pNVar3;
  Node256Leaf *pNVar4;
  ulong uVar5;
  ValidityMask mask;
  
  pNVar3 = Node::Ref<duckdb::Node15Leaf>
                     (art,(Node)(node15_leaf->super_IndexPointer).data,NODE_15_LEAF);
  pNVar4 = New(art,node256_leaf);
  Node::SetGateStatus(node256_leaf,(GateStatus)((node15_leaf->super_IndexPointer).data >> 0x3f));
  bVar1 = (pNVar3->super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>).count;
  pNVar4->count = (ushort)bVar1;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = pNVar4->mask;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mask.super_TemplatedValidityMask<unsigned_long>.capacity = 0x100;
  for (uVar5 = 0; uVar5 < bVar1; uVar5 = uVar5 + 1) {
    bVar2 = (pNVar3->super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>).key[uVar5];
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[bVar2 >> 6] =
         mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[bVar2 >> 6] |
         1L << (bVar2 & 0x3f);
  }
  (pNVar3->super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>).count = '\0';
  Node::Free(art,node15_leaf);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return pNVar4;
}

Assistant:

Node256Leaf &Node256Leaf::GrowNode15Leaf(ART &art, Node &node256_leaf, Node &node15_leaf) {
	auto &n15 = Node::Ref<Node15Leaf>(art, node15_leaf, NType::NODE_15_LEAF);
	auto &n256 = New(art, node256_leaf);
	node256_leaf.SetGateStatus(node15_leaf.GetGateStatus());

	n256.count = n15.count;
	ValidityMask mask(&n256.mask[0], Node256::CAPACITY);
	for (uint8_t i = 0; i < n15.count; i++) {
		mask.SetValid(n15.key[i]);
	}

	n15.count = 0;
	Node::Free(art, node15_leaf);
	return n256;
}